

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_click(ImGuiInputTextState *str,STB_TexteditState *state,float x,float y)

{
  float fVar1;
  StbTexteditRow *in_RSI;
  ImGuiInputTextState *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  StbTexteditRow r;
  int in_stack_ffffffffffffffe4;
  
  if (*(char *)&in_RSI->ymax != '\0') {
    STB_TEXTEDIT_LAYOUTROW
              (in_RSI,(ImGuiInputTextState *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
               in_stack_ffffffffffffffe4);
  }
  fVar1 = (float)stb_text_locate_coord(in_RDI,(float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0));
  in_RSI->x0 = fVar1;
  in_RSI->x1 = in_RSI->x0;
  in_RSI->baseline_y_delta = in_RSI->x0;
  *(undefined1 *)((long)&in_RSI->ymin + 3) = 0;
  return;
}

Assistant:

static void stb_textedit_click(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, float x, float y)
{
   // In single-line mode, just always make y = 0. This lets the drag keep working if the mouse
   // goes off the top or bottom of the text
   if( state->single_line )
   {
      StbTexteditRow r;
      STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
      y = r.ymin;
   }

   state->cursor = stb_text_locate_coord(str, x, y);
   state->select_start = state->cursor;
   state->select_end = state->cursor;
   state->has_preferred_x = 0;
}